

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclBuffer.c
# Opt level: O2

int Abc_BufCountNonCritical(Buf_Man_t *p,Abc_Obj_t *pObj)

{
  Abc_Obj_t *pFan;
  int iVar1;
  long lVar2;
  
  p->vNonCrit->nSize = 0;
  for (lVar2 = 0; lVar2 < (pObj->vFanouts).nSize; lVar2 = lVar2 + 1) {
    pFan = (Abc_Obj_t *)pObj->pNtk->vObjs->pArray[(pObj->vFanouts).pArray[lVar2]];
    iVar1 = Abc_BufEdgeSlack(p,pObj,pFan);
    if (0xdac < iVar1) {
      Vec_IntPush(p->vNonCrit,pFan->Id);
    }
  }
  return p->vNonCrit->nSize;
}

Assistant:

int Abc_BufCountNonCritical( Buf_Man_t * p, Abc_Obj_t * pObj )
{
    Abc_Obj_t * pFanout;
    int i;
    Vec_IntClear( p->vNonCrit );
    Abc_ObjForEachFanout( pObj, pFanout, i )
        if ( Abc_BufEdgeSlack( p, pObj, pFanout ) > 7*BUF_SCALE/2 )
            Vec_IntPush( p->vNonCrit, Abc_ObjId(pFanout) );
    return Vec_IntSize(p->vNonCrit);
}